

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit-math.cc
# Opt level: O0

void math_sin_pi_test(void)

{
  bool bVar1;
  double dVar2;
  double a;
  double b;
  double dVar3;
  double sin_v;
  double ref_v;
  int i;
  double kPI;
  
  dVar2 = tinyusdz::math::constants<double>::pi();
  for (ref_v._4_4_ = 0xfffffe98; (int)ref_v._4_4_ < 0x169; ref_v._4_4_ = ref_v._4_4_ + 1) {
    a = sin(((double)(int)ref_v._4_4_ * dVar2) / 180.0);
    b = tinyusdz::math::sin_pi((double)(int)ref_v._4_4_ / 180.0);
    dVar3 = std::numeric_limits<double>::epsilon();
    bVar1 = tinyusdz::math::is_close(a,b,dVar3 * 5.0);
    if (!bVar1) {
      printf("sin(%d degree) differes: ref = %lf, sin_pi = %lf\n",a,b,(ulong)ref_v._4_4_);
      acutest_check_(0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-math.cc"
                     ,0x1e,"%s","0");
    }
  }
  acutest_check_(1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-math.cc"
                 ,0x21,"%s","1");
  return;
}

Assistant:

void math_sin_pi_test(void) {

  double kPI = math::constants<double>::pi();

  for (int i = -360; i <= 360; i++) {
    double ref_v = std::sin(double(i) * kPI / 180.0);
    double sin_v = math::sin_pi(double(i)/180.0);
    // TODO: dyanmically change eps based on input degree value.
    if (!math::is_close(ref_v, sin_v, 5*std::numeric_limits<double>::epsilon())) {
      printf("sin(%d degree) differes: ref = %lf, sin_pi = %lf\n", i, ref_v, sin_v);
      TEST_CHECK(0);
    }
  }
  TEST_CHECK(1); // ok
}